

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTreeNode.cpp
# Opt level: O0

AVLTreeNode<long_long> * __thiscall
itis::AVLTreeNode<long_long>::left_rotate(AVLTreeNode<long_long> *this)

{
  AVLTreeNode<long_long> *this_00;
  AVLTreeNode<long_long> *R;
  AVLTreeNode<long_long> *this_local;
  
  this_00 = this->right;
  this->right = this->right->left;
  this_00->left = this;
  updateValues(this);
  updateValues(this_00);
  return this_00;
}

Assistant:

AVLTreeNode<T>* AVLTreeNode<T>::left_rotate() {
    AVLTreeNode* R = right;
    right = right->left;
    R->left = this;

    this->updateValues();  // the order is important
    R->updateValues();

    return R;
  }